

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

Vec_Ptr_t * Abc_NodeGetFakeNames(int nNames)

{
  undefined8 uVar1;
  undefined8 in_RAX;
  Vec_Ptr_t *p;
  undefined1 *puVar2;
  char *Entry;
  uint uVar3;
  uint uVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  p = Vec_PtrAlloc(nNames);
  uVar4 = 0;
  uVar3 = 0;
  if (0 < nNames) {
    uVar3 = nNames;
  }
  for (; uVar1 = uStack_38, uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if (nNames < 0x1a) {
      uStack_38._0_4_ = CONCAT13((char)uVar4 + 'a',(undefined3)uStack_38);
      puVar2 = (undefined1 *)((long)&uStack_38 + 4);
    }
    else {
      uStack_38._0_4_ =
           CONCAT13((char)((ulong)uVar4 / 0x1a) * -0x1a + 'a' + (char)uVar4,(undefined3)uStack_38);
      uStack_38._5_3_ = SUB83(uVar1,5);
      uStack_38._0_5_ = CONCAT14((char)((ulong)uVar4 / 0x1a) + '0',(undefined4)uStack_38);
      puVar2 = (undefined1 *)((long)&uStack_38 + 5);
    }
    *puVar2 = 0;
    Entry = Extra_UtilStrsav((char *)((long)&uStack_38 + 3));
    Vec_PtrPush(p,Entry);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NodeGetFakeNames( int nNames )
{
    Vec_Ptr_t * vNames;
    char Buffer[5];
    int i;

    vNames = Vec_PtrAlloc( nNames );
    for ( i = 0; i < nNames; i++ )
    {
        if ( nNames < 26 )
        {
            Buffer[0] = 'a' + i;
            Buffer[1] = 0;
        }
        else
        {
            Buffer[0] = 'a' + i%26;
            Buffer[1] = '0' + i/26;
            Buffer[2] = 0;
        }
        Vec_PtrPush( vNames, Extra_UtilStrsav(Buffer) );
    }
    return vNames;
}